

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockNodeRemoveWindow(ImGuiDockNode *node,ImGuiWindow *window,ImGuiID save_dock_id)

{
  int iVar1;
  ImGuiWindow **ppIVar2;
  ImGuiWindow **ppIVar3;
  ImGuiWindow *pIVar4;
  ImGuiWindow *pIVar5;
  ImGuiViewportP *pIVar6;
  ImGuiContext *ctx;
  long lVar7;
  ImGuiWindow **ppIVar8;
  long lVar9;
  ImGuiWindow **ppIVar10;
  long lVar11;
  
  ctx = GImGui;
  if (window->DockNode != node) {
    __assert_fail("window->DockNode == node",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3156,
                  "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)");
  }
  if ((save_dock_id != 0) && (node->ID != save_dock_id)) {
    __assert_fail("save_dock_id == 0 || save_dock_id == node->ID",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3159,
                  "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)");
  }
  window->DockNode = (ImGuiDockNode *)0x0;
  window->field_0x492 = window->field_0x492 & 0xfa;
  window->DockId = save_dock_id;
  UpdateWindowParentAndRootLinks(window,window->Flags & 0xfeffffff,(ImGuiWindow *)0x0);
  lVar7 = (long)(node->Windows).Size;
  if (0 < lVar7) {
    ppIVar2 = (node->Windows).Data;
    lVar9 = 0;
    ppIVar10 = ppIVar2;
    do {
      if (*ppIVar10 == window) {
        ppIVar3 = (node->Windows).Data;
        ppIVar8 = (ImGuiWindow **)((long)ppIVar3 - lVar9);
        if ((ppIVar8 < ppIVar2) || (ppIVar2 + lVar7 <= ppIVar8)) {
          __assert_fail("it >= Data && it < Data + Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                        ,0x5da,"T *ImVector<ImGuiWindow *>::erase(const T *) [T = ImGuiWindow *]");
        }
        lVar11 = (long)ppIVar3 - (long)ppIVar2;
        memmove((void *)((long)ppIVar10 + lVar11),(void *)((long)ppIVar10 + lVar11 + 8),
                (((ulong)~(lVar11 - lVar9) >> 3) + lVar7) * 8);
        (node->Windows).Size = (node->Windows).Size + -1;
        if (node->VisibleWindow == window) {
          node->VisibleWindow = (ImGuiWindow *)0x0;
        }
        node->field_0xba = node->field_0xba | 2;
        if (((node->TabBar != (ImGuiTabBar *)0x0) &&
            (TabBarRemoveTab(node->TabBar,window->ID),
            (node->Windows).Size < (int)(((node->LocalFlags & 0x800) == 0) + 1))) &&
           (node->TabBar != (ImGuiTabBar *)0x0)) {
          IM_DELETE<ImGuiTabBar>(node->TabBar);
          node->TabBar = (ImGuiTabBar *)0x0;
        }
        iVar1 = (node->Windows).Size;
        if (iVar1 == 1) {
          if (((node->LocalFlags & 0x800) == 0) &&
             (pIVar4 = node->HostWindow, pIVar4 != (ImGuiWindow *)0x0)) {
            pIVar5 = *(node->Windows).Data;
            if ((pIVar4->ViewportOwned == true) && (node->ParentNode == (ImGuiDockNode *)0x0)) {
              pIVar6 = pIVar4->Viewport;
              if (pIVar6->Window != pIVar4) {
                __assert_fail("node->HostWindow->Viewport->Window == node->HostWindow",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                              ,0x3185,
                              "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)"
                             );
              }
              pIVar6->Window = pIVar5;
              (pIVar6->super_ImGuiViewport).ID = pIVar5->ID;
            }
            pIVar5->Collapsed = pIVar4->Collapsed;
          }
        }
        else if (((iVar1 == 0) && ((node->LocalFlags & 0xc00) == 0)) && (window->DockId != node->ID)
                ) {
          DockContextRemoveNode(ctx,node,true);
          return;
        }
        DockNodeUpdateVisibleFlag(node);
        return;
      }
      ppIVar10 = ppIVar10 + 1;
      lVar9 = lVar9 + -8;
    } while (lVar7 * 8 + lVar9 != 0);
  }
  __assert_fail("erased",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                ,0x316a,"void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)")
  ;
}

Assistant:

static void ImGui::DockNodeRemoveWindow(ImGuiDockNode* node, ImGuiWindow* window, ImGuiID save_dock_id)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window->DockNode == node);
    //IM_ASSERT(window->RootWindow == node->HostWindow);
    //IM_ASSERT(window->LastFrameActive < g.FrameCount);    // We may call this from Begin()
    IM_ASSERT(save_dock_id == 0 || save_dock_id == node->ID);
    IMGUI_DEBUG_LOG_DOCKING("DockNodeRemoveWindow node 0x%08X window '%s'\n", node->ID, window->Name);

    window->DockNode = NULL;
    window->DockIsActive = window->DockTabWantClose = false;
    window->DockId = save_dock_id;
    UpdateWindowParentAndRootLinks(window, window->Flags & ~ImGuiWindowFlags_ChildWindow, NULL); // Update immediately

    // Remove window
    bool erased = false;
    for (int n = 0; n < node->Windows.Size; n++)
        if (node->Windows[n] == window)
        {
            node->Windows.erase(node->Windows.Data + n);
            erased = true;
            break;
        }
    IM_ASSERT(erased);
    if (node->VisibleWindow == window)
        node->VisibleWindow = NULL;

    // Remove tab and possibly tab bar
    node->WantHiddenTabBarUpdate = true;
    if (node->TabBar)
    {
        TabBarRemoveTab(node->TabBar, window->ID);
        const int tab_count_threshold_for_tab_bar = node->IsCentralNode() ? 1 : 2;
        if (node->Windows.Size < tab_count_threshold_for_tab_bar)
            DockNodeRemoveTabBar(node);
    }

    if (node->Windows.Size == 0 && !node->IsCentralNode() && !node->IsDockSpace() && window->DockId != node->ID)
    {
        // Automatic dock node delete themselves if they are not holding at least one tab
        DockContextRemoveNode(&g, node, true);
        return;
    }

    if (node->Windows.Size == 1 && !node->IsCentralNode() && node->HostWindow)
    {
        ImGuiWindow* remaining_window = node->Windows[0];
        if (node->HostWindow->ViewportOwned && node->IsRootNode())
        {
            // Transfer viewport back to the remaining loose window
            IM_ASSERT(node->HostWindow->Viewport->Window == node->HostWindow);
            node->HostWindow->Viewport->Window = remaining_window;
            node->HostWindow->Viewport->ID = remaining_window->ID;
        }
        remaining_window->Collapsed = node->HostWindow->Collapsed;
    }

    // Update visibility immediately is required so the DockNodeUpdateRemoveInactiveChilds() processing can reflect changes up the tree
    DockNodeUpdateVisibleFlag(node);
}